

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deSocket * deSocket_accept(deSocket *sock,deSocketAddress *clientAddress)

{
  int __fd;
  deSocket *pdVar1;
  deMutex dVar2;
  int addrLen;
  NativeSocklen bsdAddrLen;
  deUint8 bsdAddrBuf [28];
  
  bsdAddrLen = 0x1c;
  bsdAddrBuf[0] = '\0';
  bsdAddrBuf[1] = '\0';
  bsdAddrBuf[2] = '\0';
  bsdAddrBuf[3] = '\0';
  bsdAddrBuf[4] = '\0';
  bsdAddrBuf[5] = '\0';
  bsdAddrBuf[6] = '\0';
  bsdAddrBuf[7] = '\0';
  bsdAddrBuf[8] = '\0';
  bsdAddrBuf[9] = '\0';
  bsdAddrBuf[10] = '\0';
  bsdAddrBuf[0xb] = '\0';
  bsdAddrBuf[0xc] = '\0';
  bsdAddrBuf[0xd] = '\0';
  bsdAddrBuf[0xe] = '\0';
  bsdAddrBuf[0xf] = '\0';
  bsdAddrBuf[0x10] = '\0';
  bsdAddrBuf[0x11] = '\0';
  bsdAddrBuf[0x12] = '\0';
  bsdAddrBuf[0x13] = '\0';
  bsdAddrBuf[0x14] = '\0';
  bsdAddrBuf[0x15] = '\0';
  bsdAddrBuf[0x16] = '\0';
  bsdAddrBuf[0x17] = '\0';
  bsdAddrBuf[0x18] = '\0';
  bsdAddrBuf[0x19] = '\0';
  bsdAddrBuf[0x1a] = '\0';
  bsdAddrBuf[0x1b] = '\0';
  __fd = accept(sock->handle,(sockaddr *)bsdAddrBuf,&bsdAddrLen);
  if (__fd != -1) {
    pdVar1 = (deSocket *)deCalloc(0x18);
    if (pdVar1 != (deSocket *)0x0) {
      dVar2 = deMutex_create((deMutexAttributes *)0x0);
      pdVar1->stateLock = dVar2;
      pdVar1->handle = __fd;
      pdVar1->state = DE_SOCKETSTATE_CONNECTED;
      pdVar1->openChannels = 3;
      if (clientAddress == (deSocketAddress *)0x0) {
        return pdVar1;
      }
      deBsdAddressToSocketAddress(clientAddress,(sockaddr *)bsdAddrBuf,addrLen);
      return pdVar1;
    }
    close(__fd);
  }
  return (deSocket *)0x0;
}

Assistant:

deSocket* deSocket_accept (deSocket* sock, deSocketAddress* clientAddress)
{
	deSocketHandle		newFd		= DE_INVALID_SOCKET_HANDLE;
	deSocket*			newSock		= DE_NULL;
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen	= (NativeSocklen)sizeof(bsdAddrBuf);

	deMemset(bsdAddr, 0, (size_t)bsdAddrLen);

	newFd = accept(sock->handle, bsdAddr, &bsdAddrLen);
	if (!deSocketHandleIsValid(newFd))
		return DE_NULL;

	newSock = (deSocket*)deCalloc(sizeof(deSocket));
	if (!newSock)
	{
#if defined(DE_USE_WINSOCK)
		closesocket(newFd);
#else
		close(newFd);
#endif
		return DE_NULL;
	}

	newSock->stateLock		= deMutex_create(0);
	newSock->handle			= newFd;
	newSock->state			= DE_SOCKETSTATE_CONNECTED;
	newSock->openChannels	= DE_SOCKETCHANNEL_BOTH;

	if (clientAddress)
		deBsdAddressToSocketAddress(clientAddress, bsdAddr, (int)bsdAddrLen);

	return newSock;
}